

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O0

bool apngasm::spec::priv::anon_unknown_0::s2u(string *str,uint *pOut)

{
  uint uVar1;
  bad_lexical_cast *e;
  uint *pOut_local;
  string *str_local;
  
  if (pOut != (uint *)0x0) {
    uVar1 = boost::lexical_cast<unsigned_int,std::__cxx11::string>(str);
    *pOut = uVar1;
  }
  return pOut != (uint *)0x0;
}

Assistant:

bool s2u(const std::string& str, unsigned int* pOut)
        {
          if(pOut == NULL)
            return false;

          try
          {
            *pOut = boost::lexical_cast<unsigned int>(str);
            return true;
          }
          catch(boost::bad_lexical_cast& e)
          {
            return false;
          }
        }